

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_utf8.c
# Opt level: O3

void t49(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char *pcVar6;
  ALLEGRO_USTR_INFO repli;
  ALLEGRO_USTR_INFO findi;
  undefined1 auStack_38 [16];
  undefined1 local_28 [16];
  
  uVar3 = al_ustr_new(anon_var_dwarf_bb2);
  uVar4 = al_ref_cstr(local_28,anon_var_dwarf_486 + 5);
  uVar5 = al_ref_cstr(auStack_38,"deef");
  cVar1 = al_ustr_find_replace(uVar3,0,uVar4,uVar5);
  if (cVar1 == '\0') {
    log_printf("FAIL %s\n","al_ustr_find_replace(us, 0, find, repl)");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","al_ustr_find_replace(us, 0, find, repl)");
  }
  pcVar6 = (char *)al_cstr(uVar3);
  iVar2 = strcmp(pcVar6,anon_var_dwarf_14ff);
  if (iVar2 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_150b);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_150b);
    error = error + 1;
  }
  uVar4 = al_ref_cstr(local_28,anon_var_dwarf_1523);
  uVar5 = al_ref_cstr(auStack_38,anon_var_dwarf_152f);
  cVar1 = al_ustr_find_replace(uVar3,0xe,uVar4,uVar5);
  if (cVar1 == '\0') {
    log_printf("FAIL %s\n","al_ustr_find_replace(us, 14, find, repl)");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","al_ustr_find_replace(us, 14, find, repl)");
  }
  pcVar6 = (char *)al_cstr(uVar3);
  iVar2 = strcmp(pcVar6,anon_var_dwarf_1547);
  if (iVar2 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_1553);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_1553);
    error = error + 1;
  }
  cVar1 = al_ustr_find_replace_cstr(uVar3,0,"dd",anon_var_dwarf_156b);
  if (cVar1 == '\0') {
    log_printf("FAIL %s\n",anon_var_dwarf_1577);
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n",anon_var_dwarf_1577);
  }
  pcVar6 = (char *)al_cstr(uVar3);
  iVar2 = strcmp(pcVar6,anon_var_dwarf_1583);
  if (iVar2 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_158f);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_158f);
    error = error + 1;
  }
  uVar4 = al_ustr_empty_string();
  cVar1 = al_ustr_find_replace(uVar3,0,uVar4,uVar5);
  if (cVar1 == '\0') {
    log_printf("OK   %s\n","! al_ustr_find_replace(us, 0, find, repl)");
  }
  else {
    log_printf("FAIL %s\n","! al_ustr_find_replace(us, 0, find, repl)");
    error = error + 1;
  }
  pcVar6 = (char *)al_cstr(uVar3);
  iVar2 = strcmp(pcVar6,anon_var_dwarf_1583);
  if (iVar2 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_158f);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_158f);
    error = error + 1;
  }
  al_ustr_free(uVar3);
  return;
}

Assistant:

static void t49(void)
{
   ALLEGRO_USTR *us;
   ALLEGRO_USTR_INFO findi;
   ALLEGRO_USTR_INFO repli;
   const ALLEGRO_USTR *find;
   const ALLEGRO_USTR *repl;

   us = al_ustr_new("aábdðeéfghiíaábdðeéfghií");
   find = al_ref_cstr(&findi, "ðeéf");
   repl = al_ref_cstr(&repli, "deef");

   CHECK(al_ustr_find_replace(us, 0, find, repl));
   CHECK(0 == strcmp(al_cstr(us), "aábddeefghiíaábddeefghií"));

   find = al_ref_cstr(&findi, "aá");
   repl = al_ref_cstr(&repli, "AÁ");

   CHECK(al_ustr_find_replace(us, 14, find, repl));
   CHECK(0 == strcmp(al_cstr(us), "aábddeefghiíAÁbddeefghií"));

   CHECK(al_ustr_find_replace_cstr(us, 0, "dd", "đ"));
   CHECK(0 == strcmp(al_cstr(us), "aábđeefghiíAÁbđeefghií"));

   /* Not allowed */
   find = al_ustr_empty_string();
   CHECK(! al_ustr_find_replace(us, 0, find, repl));
   CHECK(0 == strcmp(al_cstr(us), "aábđeefghiíAÁbđeefghií"));

   al_ustr_free(us);
}